

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O3

void __thiscall duckdb::JoinHashTable::ProbeState::ProbeState(ProbeState *this)

{
  LogicalType local_50;
  LogicalType local_38;
  
  SharedState::SharedState(&this->super_SharedState);
  LogicalType::LogicalType(&local_38,UBIGINT);
  Vector::Vector(&this->ht_offsets_v,&local_38,0x800);
  LogicalType::~LogicalType(&local_38);
  LogicalType::LogicalType(&local_50,UBIGINT);
  Vector::Vector(&this->ht_offsets_dense_v,&local_50,0x800);
  LogicalType::~LogicalType(&local_50);
  SelectionVector::SelectionVector(&this->non_empty_sel,0x800);
  return;
}

Assistant:

JoinHashTable::ProbeState::ProbeState()
    : SharedState(), ht_offsets_v(LogicalType::UBIGINT), ht_offsets_dense_v(LogicalType::UBIGINT),
      non_empty_sel(STANDARD_VECTOR_SIZE) {
}